

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qdatetimeedit.cpp
# Opt level: O3

void __thiscall QDateTimeEdit::initStyleOption(QDateTimeEdit *this,QStyleOptionSpinBox *option)

{
  long lVar1;
  
  if (option != (QStyleOptionSpinBox *)0x0) {
    lVar1 = *(long *)&(this->super_QAbstractSpinBox).super_QWidget.field_0x8;
    QAbstractSpinBox::initStyleOption((QAbstractSpinBox *)this,option);
    if ((*(char *)(lVar1 + 0x4fa) == '\x01') && ((*(uint *)(lVar1 + 0x470) & 0x3f00) != 0)) {
      (option->super_QStyleOptionComplex).subControls.
      super_QFlagsStorageHelper<QStyle::SubControl,_4>.super_QFlagsStorage<QStyle::SubControl>.i = 7
      ;
      (option->super_QStyleOptionComplex).super_QStyleOption.state.
      super_QFlagsStorageHelper<QStyle::StateFlag,_4>.super_QFlagsStorage<QStyle::StateFlag>.i =
           ((option->super_QStyleOptionComplex).super_QStyleOption.state.
            super_QFlagsStorageHelper<QStyle::StateFlag,_4>.super_QFlagsStorage<QStyle::StateFlag>.i
           & 0xfffffffb) + (uint)(*(int *)(lVar1 + 0x4fc) == 4) * 4;
    }
  }
  return;
}

Assistant:

void QDateTimeEdit::initStyleOption(QStyleOptionSpinBox *option) const
{
    if (!option)
        return;

    Q_D(const QDateTimeEdit);
    QAbstractSpinBox::initStyleOption(option);
    if (d->calendarPopupEnabled()) {
        option->subControls = QStyle::SC_ComboBoxFrame | QStyle::SC_ComboBoxEditField
                              | QStyle::SC_ComboBoxArrow;
        if (d->arrowState == QStyle::State_Sunken)
            option->state |= QStyle::State_Sunken;
        else
            option->state &= ~QStyle::State_Sunken;
    }
}